

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O2

Am_Object generate_search_group
                    (Am_Value_List *pos_slots,char *main_label,int *current_y,bool main_check_box,
                    Am_Value_List *slots_to_item,Am_Value_List *slots_values)

{
  Am_Object_Data *pAVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Am_Object *pAVar5;
  Am_Object *pAVar6;
  Am_Constraint *pAVar7;
  Am_Wrapper *pAVar8;
  Am_Value *pAVar9;
  char *value;
  ostream *poVar10;
  undefined7 in_register_00000009;
  int *piVar11;
  Am_Slot_Key AVar12;
  int iVar13;
  anon_union_8_8_ea4c8939_for_value aVar14;
  Am_Value_List *in_stack_00000008;
  Am_Value this_value;
  Am_Am_Slot_Key this_slot;
  Am_Value_List local_b0;
  Am_Object_Data *local_a0;
  Am_Value local_98;
  Am_Value_List *local_88;
  Am_Object this_item;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Value_List sub_parts;
  
  piVar11 = (int *)CONCAT71(in_register_00000009,main_check_box);
  pos_slots->data = (Am_Value_List_Data *)0x0;
  this_slot.value = 0;
  this_item.data = (Am_Object_Data *)0x0;
  local_a0 = (Am_Object_Data *)pos_slots;
  local_88 = (Am_Value_List *)main_label;
  Am_Value_List::Am_Value_List(&sub_parts);
  Am_Object::Create((Am_Object *)&local_98,(char *)&Am_Group);
  pAVar5 = Am_Object::Set((Am_Object *)&local_98,100,5,0);
  pAVar5 = Am_Object::Set(pAVar5,0x65,*piVar11,0);
  pAVar5 = Am_Object::Set(pAVar5,0x66,0x1b8,0);
  Am_Object::Create(&local_68,(char *)&Am_Border_Rectangle);
  pAVar6 = Am_Object::Set(&local_68,100,0,0);
  pAVar6 = Am_Object::Set(pAVar6,0x65,0,0);
  Am_From_Owner((Am_Slot_Key)&this_value);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&this_value);
  pAVar6 = Am_Object::Set(pAVar6,0x66,pAVar7,0);
  Am_From_Owner((Am_Slot_Key)&local_b0);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&local_b0);
  pAVar6 = Am_Object::Set(pAVar6,0x67,pAVar7,0);
  pAVar6 = Am_Object::Set(pAVar6,0x172,0,0);
  pAVar8 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Default_Color);
  pAVar6 = Am_Object::Set(pAVar6,0x6a,pAVar8,0);
  Am_Object::Am_Object(&local_60,pAVar6);
  pAVar5 = Am_Object::Add_Part(pAVar5,&local_60,true,0);
  Am_Object::operator=((Am_Object *)local_a0,pAVar5);
  Am_Object::~Am_Object(&local_60);
  Am_Formula::~Am_Formula((Am_Formula *)&local_b0);
  Am_Formula::~Am_Formula((Am_Formula *)&this_value);
  Am_Object::~Am_Object(&local_68);
  Am_Object::~Am_Object((Am_Object *)&local_98);
  AVar12 = Am_MAIN_BUTTON;
  if ((char)slots_to_item == '\0') {
    Am_Object::Create((Am_Object *)&this_value,(char *)&Am_Text);
    pAVar5 = Am_Object::Set((Am_Object *)&this_value,100,10,0);
    pAVar5 = Am_Object::Set(pAVar5,0x65,10,0);
    pAVar5 = Am_Object::Set(pAVar5,0xab,(char *)current_y,0);
    pAVar8 = Am_Font::operator_cast_to_Am_Wrapper_(&search_bold_font);
    pAVar5 = Am_Object::Set(pAVar5,0xac,pAVar8,0);
    pAVar8 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Black);
    pAVar5 = Am_Object::Set(pAVar5,0x6b,pAVar8,0);
    pAVar8 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_No_Style);
    pAVar5 = Am_Object::Set(pAVar5,0x6a,pAVar8,0);
    Am_Object::Am_Object(&local_78,pAVar5);
    Am_Object::Add_Part((Am_Object *)local_a0,&local_78,true,0);
    Am_Object::~Am_Object(&local_78);
    Am_Object::~Am_Object((Am_Object *)&this_value);
    iVar3 = 0x14;
  }
  else {
    Am_Object::Create((Am_Object *)&this_value,(char *)&search_item_proto);
    pAVar5 = Am_Object::Set((Am_Object *)&this_value,100,10,0);
    pAVar5 = Am_Object::Set(pAVar5,0x65,5,0);
    pAVar5 = Am_Object::Set(pAVar5,0x150,(char *)current_y,0);
    pAVar5 = Am_Object::Set(pAVar5,0xcc,true,0);
    Am_Object::Am_Object(&local_70,pAVar5);
    pAVar1 = local_a0;
    Am_Object::Add_Part((Am_Object *)local_a0,AVar12,&local_70,0);
    Am_Object::~Am_Object(&local_70);
    Am_Object::~Am_Object((Am_Object *)&this_value);
    Am_Object::Get_Object((Am_Object *)&local_b0,(Am_Slot_Key)pAVar1,(ulong)Am_MAIN_BUTTON);
    Am_Object::Get_Object((Am_Object *)&this_value,(Am_Slot_Key)&local_b0,(ulong)Am_USE_ITEM);
    pAVar9 = Am_Object::Get((Am_Object *)&this_value,0x66,0);
    iVar3 = Am_Value::operator_cast_to_int(pAVar9);
    Am_Object::~Am_Object((Am_Object *)&this_value);
    Am_Object::~Am_Object((Am_Object *)&local_b0);
    Am_Object::Get_Object((Am_Object *)&this_value,(Am_Slot_Key)local_a0,(ulong)Am_MAIN_BUTTON);
    Am_Object::Set((Am_Object *)&this_value,0x11d,iVar3,0);
    Am_Object::~Am_Object((Am_Object *)&this_value);
    Am_Object::Get_Object((Am_Object *)&local_b0,(Am_Slot_Key)local_a0,(ulong)Am_MAIN_BUTTON);
    Am_Object::Get_Object((Am_Object *)&this_value,(Am_Slot_Key)&local_b0,(ulong)Am_USE_ITEM);
    pAVar8 = Am_Font::operator_cast_to_Am_Wrapper_(&search_bold_font);
    Am_Object::Set((Am_Object *)&this_value,0xac,pAVar8,0);
    Am_Object::~Am_Object((Am_Object *)&this_value);
    Am_Object::~Am_Object((Am_Object *)&local_b0);
    iVar3 = 0x23;
  }
  this_value.type = 0;
  this_value.value.wrapper_value = (Am_Wrapper *)0x0;
  Am_Value_List::Start(local_88);
  iVar13 = 0;
  while( true ) {
    bVar2 = Am_Value_List::Last(local_88);
    if (bVar2) {
      Am_Value_List::Start(&sub_parts);
      while( true ) {
        bVar2 = Am_Value_List::Last(&sub_parts);
        if (bVar2) break;
        pAVar9 = Am_Value_List::Get(&sub_parts);
        Am_Object::operator=(&this_item,pAVar9);
        Am_Object::Set(&this_item,0x11d,iVar13 + 2,0);
        Am_Value_List::Next(&sub_parts);
      }
      Am_Object::Set((Am_Object *)local_a0,0x67,iVar3,0);
      *piVar11 = *piVar11 + iVar3;
      Am_Value::~Am_Value(&this_value);
      Am_Value_List::~Am_Value_List(&sub_parts);
      Am_Object::~Am_Object(&this_item);
      return (Am_Object)local_a0;
    }
    pAVar9 = Am_Value_List::Get(local_88);
    Am_Am_Slot_Key::Am_Am_Slot_Key((Am_Am_Slot_Key *)&local_b0,pAVar9);
    aVar14.long_value._2_6_ = 0;
    aVar14.long_value._0_2_ = (ushort)local_b0.data;
    this_slot.value = (ushort)local_b0.data;
    value = Am_Get_Slot_Name((ushort)local_b0.data);
    Am_Object::Create((Am_Object *)&local_b0,(char *)&search_item_proto);
    pAVar5 = Am_Object::Set((Am_Object *)&local_b0,100,0x1e,0);
    pAVar5 = Am_Object::Set(pAVar5,0x65,iVar3,0);
    pAVar5 = Am_Object::Set(pAVar5,0x150,value,0);
    Am_Object::operator=(&this_item,pAVar5);
    Am_Object::~Am_Object((Am_Object *)&local_b0);
    local_98.type = 0x4015;
    local_98.value = aVar14;
    Am_Value_List::Assoc_2(&local_b0,(Am_Value *)in_stack_00000008);
    Am_Value::operator=(&this_value,(Am_Value *)&local_b0);
    Am_Value::~Am_Value((Am_Value *)&local_b0);
    Am_Value::~Am_Value(&local_98);
    bVar2 = Am_Value::Exists(&this_value);
    if (!bVar2) break;
    AVar12 = (Am_Slot_Key)&this_item;
    Am_Object::Get_Object((Am_Object *)&local_b0,AVar12,(ulong)Am_ITEM_VALUE);
    Am_Object::Set((Am_Object *)&local_b0,0xfa,&this_value,0);
    Am_Object::~Am_Object((Am_Object *)&local_b0);
    local_b0.data._0_2_ = 0x4015;
    local_b0.item = (Am_List_Item *)aVar14;
    pAVar8 = Am_Object::operator_cast_to_Am_Wrapper_(&this_item);
    Am_Assoc::Am_Assoc((Am_Assoc *)&local_98,(Am_Value *)&local_b0,pAVar8);
    pAVar8 = Am_Assoc::operator_cast_to_Am_Wrapper_((Am_Assoc *)&local_98);
    Am_Value_List::Add(slots_values,pAVar8,Am_TAIL,true);
    Am_Assoc::~Am_Assoc((Am_Assoc *)&local_98);
    Am_Value::~Am_Value((Am_Value *)&local_b0);
    pAVar8 = Am_Object::operator_cast_to_Am_Wrapper_(&this_item);
    Am_Value_List::Add(&sub_parts,pAVar8,Am_TAIL,true);
    Am_Object::Get_Object((Am_Object *)&local_b0,AVar12,(ulong)Am_USE_ITEM);
    pAVar9 = Am_Object::Get((Am_Object *)&local_b0,0x66,0);
    iVar4 = Am_Value::operator_cast_to_int(pAVar9);
    Am_Object::~Am_Object((Am_Object *)&local_b0);
    if (iVar13 < iVar4) {
      iVar13 = iVar4;
    }
    Am_Object::Am_Object(&local_58,&this_item);
    Am_Object::Add_Part((Am_Object *)local_a0,&local_58,true,0);
    Am_Object::~Am_Object(&local_58);
    iVar3 = iVar3 + 0x1e;
    Am_Value_List::Next(local_88);
  }
  poVar10 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
  poVar10 = std::operator<<(poVar10,"Lost value for key ");
  poVar10 = operator<<(poVar10,&this_slot);
  poVar10 = std::operator<<(poVar10," from ");
  poVar10 = operator<<(poVar10,in_stack_00000008);
  std::endl<char,std::char_traits<char>>(poVar10);
  Am_Error();
}

Assistant:

Am_Object
generate_search_group(Am_Value_List &pos_slots, const char *main_label,
                      int &current_y, bool main_check_box,
                      Am_Value_List &slots_to_item, Am_Value_List &slots_values)
{
  Am_Object group;
  Am_Am_Slot_Key this_slot;
  const char *s;
  Am_Object this_item;
  int max_item_width = 0;
  int this_w;
  int this_y = 0;
  Am_Value_List sub_parts;
  group = Am_Group.Create()
              .Set(Am_LEFT, 5)
              .Set(Am_TOP, current_y)
              .Set(Am_WIDTH, WINDOW_WIDTH - 10)
              .Add_Part(Am_Border_Rectangle.Create()
                            .Set(Am_LEFT, 0)
                            .Set(Am_TOP, 0)
                            .Set(Am_WIDTH, Am_From_Owner(Am_WIDTH))
                            .Set(Am_HEIGHT, Am_From_Owner(Am_HEIGHT))
                            .Set(Am_SELECTED, 0)
                            .Set(Am_FILL_STYLE, Am_Default_Color));

  if (main_check_box) {
    group.Add_Part(Am_MAIN_BUTTON, search_item_proto.Create()
                                       .Set(Am_LEFT, 10)
                                       .Set(Am_TOP, 5)
                                       .Set(Am_LABEL, main_label)
                                       .Set(Am_ACTIVE, true));
    max_item_width =
        group.Get_Object(Am_MAIN_BUTTON).Get_Object(Am_USE_ITEM).Get(Am_WIDTH);
    group.Get_Object(Am_MAIN_BUTTON).Set(Am_X_OFFSET, max_item_width);
    group.Get_Object(Am_MAIN_BUTTON)
        .Get_Object(Am_USE_ITEM)
        .Set(Am_FONT, search_bold_font);
    this_y += ITEM_SIZE + 5;
  } else {
    group.Add_Part(Am_Text.Create()
                       .Set(Am_LEFT, 2 * OFFSET)
                       .Set(Am_TOP, 2 * OFFSET)
                       .Set(Am_TEXT, main_label)
                       .Set(Am_FONT, search_bold_font)
                       .Set(Am_LINE_STYLE, Am_Black)
                       .Set(Am_FILL_STYLE, Am_No_Style));
    this_y += 20;
  }
  max_item_width = 0;
  Am_Value this_value;
  for (pos_slots.Start(); !pos_slots.Last(); pos_slots.Next()) {
    this_slot = Am_Am_Slot_Key(pos_slots.Get());
    s = Am_Get_Slot_Name(this_slot);
    this_item = search_item_proto.Create()
                    .Set(Am_LEFT, INDENT_OFFSET)
                    .Set(Am_TOP, this_y)
                    .Set(Am_LABEL, s);
    this_value = slots_values.Assoc_2(this_slot);
    if (!this_value.Exists())
      Am_ERROR("Lost value for key " << this_slot << " from " << slots_values);
    this_item.Get_Object(Am_ITEM_VALUE).Set(Am_VALUES, this_value);
    slots_to_item.Add(Am_Assoc(this_slot, this_item));
    sub_parts.Add(this_item);
    this_y += ITEM_SIZE;
    this_w = this_item.Get_Object(Am_USE_ITEM).Get(Am_WIDTH);
    if (this_w > max_item_width)
      max_item_width = this_w;
    group.Add_Part(this_item);
  }
  for (sub_parts.Start(); !sub_parts.Last(); sub_parts.Next()) {
    this_item = sub_parts.Get();
    this_item.Set(Am_X_OFFSET, max_item_width + 2);
  }
  group.Set(Am_HEIGHT, this_y);
  current_y += this_y;
  return group;
}